

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.hpp
# Opt level: O1

void __thiscall duckdb::DataChunk::Reference(DataChunk *this,DataChunk *chunk)

{
  idx_t iVar1;
  reference this_00;
  reference other;
  size_type __n;
  
  iVar1 = chunk->capacity;
  this->count = chunk->count;
  this->capacity = iVar1;
  if ((chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_00 = vector<duckdb::Vector,_true>::operator[](&this->data,__n);
      other = vector<duckdb::Vector,_true>::operator[](&chunk->data,__n);
      Vector::Reference(this_00,other);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(chunk->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(chunk->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

inline idx_t size() const { // NOLINT
		return count;
	}